

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_libapi.cpp
# Opt level: O0

ze_result_t
zetMetricQueryCreate
          (zet_metric_query_pool_handle_t hMetricQueryPool,uint32_t index,
          zet_metric_query_handle_t *phMetricQuery)

{
  zet_pfnMetricQueryCreate_t p_Var1;
  __pointer_type p_Var2;
  zet_pfnMetricQueryCreate_t pfnCreate;
  zet_metric_query_handle_t *phMetricQuery_local;
  uint32_t index_local;
  zet_metric_query_pool_handle_t hMetricQueryPool_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zet_dditable_t_*>::load
                       ((atomic<_zet_dditable_t_*> *)(ze_lib::context + 0x18),memory_order_seq_cst);
    p_Var1 = (p_Var2->MetricQuery).pfnCreate;
    if (p_Var1 == (zet_pfnMetricQueryCreate_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hMetricQueryPool_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hMetricQueryPool_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hMetricQueryPool_local._4_4_ = (*p_Var1)(hMetricQueryPool,index,phMetricQuery);
    }
  }
  else {
    hMetricQueryPool_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hMetricQueryPool_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zetMetricQueryCreate(
    zet_metric_query_pool_handle_t hMetricQueryPool,///< [in] handle of the metric query pool
    uint32_t index,                                 ///< [in] index of the query within the pool
    zet_metric_query_handle_t* phMetricQuery        ///< [out] handle of metric query
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zet_pfnMetricQueryCreate_t pfnCreate = [&result] {
        auto pfnCreate = ze_lib::context->zetDdiTable.load()->MetricQuery.pfnCreate;
        if( nullptr == pfnCreate ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnCreate;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnCreate( hMetricQueryPool, index, phMetricQuery );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnCreate = ze_lib::context->zetDdiTable.load()->MetricQuery.pfnCreate;
    if( nullptr == pfnCreate ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnCreate( hMetricQueryPool, index, phMetricQuery );
    #endif
}